

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeCornerAngles
          (IntrinsicGeometryInterface *this)

{
  double dVar1;
  double dVar2;
  Edge e;
  Edge e_00;
  Edge e_01;
  Corner e_02;
  bool bVar3;
  runtime_error *this_00;
  double *pdVar4;
  MeshData<geometrycentral::surface::Corner,_double> *in_RDI;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double angle;
  double q;
  double lB;
  double lA;
  double lOpp;
  Halfedge heB;
  Halfedge heOpp;
  Halfedge heA;
  Corner c;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::CornerRangeF> __begin2;
  CornerSet *__range2;
  MeshData<geometrycentral::surface::Corner,_double> *in_stack_fffffffffffffd78;
  SurfaceMesh *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  MeshData<geometrycentral::surface::Edge,_double> *in_stack_fffffffffffffd90;
  ParentMeshT *in_stack_fffffffffffffd98;
  size_t in_stack_fffffffffffffda0;
  ParentMeshT *in_stack_fffffffffffffda8;
  allocator *paVar11;
  ParentMeshT *in_stack_fffffffffffffdb8;
  ParentMeshT *in_stack_fffffffffffffdc8;
  int __val;
  allocator local_1a1;
  string local_1a0 [160];
  string local_100 [32];
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_e0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_d0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_c0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_b0;
  Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh> local_a0;
  undefined1 local_60 [24];
  undefined1 *local_48;
  
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_fffffffffffffd80);
  MeshData<geometrycentral::surface::Corner,_double>::MeshData(in_RDI,in_stack_fffffffffffffda8);
  MeshData<geometrycentral::surface::Corner,_double>::operator=
            ((MeshData<geometrycentral::surface::Corner,_double> *)in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78);
  MeshData<geometrycentral::surface::Corner,_double>::~MeshData
            ((MeshData<geometrycentral::surface::Corner,_double> *)in_stack_fffffffffffffd80);
  SurfaceMesh::corners(in_stack_fffffffffffffd80);
  local_48 = local_60;
  RangeSetBase<geometrycentral::surface::CornerRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::CornerRangeF> *)in_stack_fffffffffffffd80);
  RangeSetBase<geometrycentral::surface::CornerRangeF>::end
            ((RangeSetBase<geometrycentral::surface::CornerRangeF> *)in_stack_fffffffffffffd80);
  while( true ) {
    __val = (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
    bVar3 = RangeIteratorBase<geometrycentral::surface::CornerRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)
                       in_stack_fffffffffffffd80,
                       (RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)
                       in_stack_fffffffffffffd78);
    if (!bVar3) {
      return;
    }
    local_a0 = (Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>)
               RangeIteratorBase<geometrycentral::surface::CornerRangeF>::operator*
                         ((RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)0x242bdf);
    local_b0 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
               Corner::halfedge((Corner *)0x242bfc);
    local_c0 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
               Halfedge::next((Halfedge *)in_stack_fffffffffffffd80);
    local_d0 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
               Halfedge::next((Halfedge *)in_stack_fffffffffffffd80);
    local_e0 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
               Halfedge::next((Halfedge *)in_stack_fffffffffffffd80);
    bVar3 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            operator==(&local_e0,&local_b0);
    if (((bVar3 ^ 0xffU) & 1) != 0) break;
    in_stack_fffffffffffffd80 = (SurfaceMesh *)&in_RDI[0xf].permuteCallbackIt;
    Halfedge::edge((Halfedge *)in_stack_fffffffffffffd80);
    e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         in_stack_fffffffffffffda0;
    e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         in_stack_fffffffffffffd98;
    pdVar4 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                       (in_stack_fffffffffffffd90,e);
    dVar5 = *pdVar4;
    in_stack_fffffffffffffd88 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &in_RDI[0xf].permuteCallbackIt;
    Halfedge::edge((Halfedge *)in_stack_fffffffffffffd80);
    e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         in_stack_fffffffffffffda0;
    e_00.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         in_stack_fffffffffffffd98;
    pdVar4 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                       (in_stack_fffffffffffffd90,e_00);
    dVar1 = *pdVar4;
    in_stack_fffffffffffffd90 =
         (MeshData<geometrycentral::surface::Edge,_double> *)&in_RDI[0xf].permuteCallbackIt;
    Halfedge::edge((Halfedge *)in_stack_fffffffffffffd80);
    e_01.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         in_stack_fffffffffffffda0;
    e_01.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         in_stack_fffffffffffffd98;
    pdVar4 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                       (in_stack_fffffffffffffd90,e_01);
    dVar2 = *pdVar4;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar1;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar1;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar2 * dVar2;
    auVar6 = vfmadd213sd_fma(auVar10,auVar6,auVar8);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar5;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = -dVar5;
    auVar6 = vfmadd213sd_fma(auVar7,auVar9,auVar6);
    dVar5 = clamp<double>(auVar6._0_8_ / (dVar1 * 2.0 * dVar2),-1.0,1.0);
    in_stack_fffffffffffffd98 = (ParentMeshT *)acos(dVar5);
    e_02.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.ind
         = in_stack_fffffffffffffda0;
    e_02.super_Element<geometrycentral::surface::Corner,_geometrycentral::surface::SurfaceMesh>.mesh
         = in_stack_fffffffffffffd98;
    in_stack_fffffffffffffdb8 = local_a0.mesh;
    in_stack_fffffffffffffdc8 = in_stack_fffffffffffffd98;
    pdVar4 = MeshData<geometrycentral::surface::Corner,_double>::operator[]
                       ((MeshData<geometrycentral::surface::Corner,_double> *)
                        in_stack_fffffffffffffd90,e_02);
    *pdVar4 = (double)in_stack_fffffffffffffd98;
    RangeIteratorBase<geometrycentral::surface::CornerRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::CornerRangeF> *)
               in_stack_fffffffffffffd80);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  paVar11 = &local_1a1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]gc-polyscope-project-template/deps/geometry-central/src/surface/intrinsic_geometry_interface.cpp"
             ,paVar11);
  ::std::operator+((char *)in_stack_fffffffffffffd88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd80);
  ::std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
  ::std::__cxx11::to_string(__val);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffdb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  ::std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
  ::std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
  ::std::runtime_error::runtime_error(this_00,local_100);
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void IntrinsicGeometryInterface::computeCornerAngles() {
  edgeLengthsQ.ensureHave();

  cornerAngles = CornerData<double>(mesh);

  for (Corner c : mesh.corners()) {
    // WARNING: Logic duplicated between cached and immediate version
    Halfedge heA = c.halfedge();
    Halfedge heOpp = heA.next();
    Halfedge heB = heOpp.next();

    GC_SAFETY_ASSERT(heB.next() == heA, "faces must be triangular");

    double lOpp = edgeLengths[heOpp.edge()];
    double lA = edgeLengths[heA.edge()];
    double lB = edgeLengths[heB.edge()];

    double q = (lA * lA + lB * lB - lOpp * lOpp) / (2. * lA * lB);
    q = clamp(q, -1.0, 1.0);
    double angle = std::acos(q);

    cornerAngles[c] = angle;
  }
}